

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O3

void adios2::helper::IOYAML(ADIOS *adios,Node *ioMap,IO *io,string *hint)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  string *map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  value vVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  Node transportsSequence;
  const_iterator it;
  Params parameters;
  Node variablesSequence;
  Params parameters_1;
  Node engineMap;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  _Base_ptr local_348;
  undefined1 local_338 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_308;
  node *local_300;
  iterator_base<const_YAML::detail::iterator_value> local_2f8;
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  _Alloc_hider local_280;
  char local_270 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  _Alloc_hider local_240;
  char local_230 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  Node *local_208;
  Node local_200;
  string local_1c0;
  string local_1a0;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_f0;
  Node local_d0;
  string local_90;
  Node local_70;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Engine","");
  map = hint;
  local_208 = ioMap;
  anon_unknown_0::YAMLNode(&local_d0,&local_f0,ioMap,hint,false,Map);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((local_d0.m_isValid == true) &&
     ((local_d0.m_pNode == (node *)0x0 ||
      ((((((local_d0.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    anon_unknown_0::YAMLNodeMapToParams((Params *)local_2c8,&local_d0,hint);
    pcVar1 = (pointer)((long)&local_200 + 0x10);
    local_200._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Type","");
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_2c8,(key_type *)&local_200);
    if ((pointer)local_200._0_8_ != pcVar1) {
      operator_delete((void *)local_200._0_8_);
    }
    if (iVar3._M_node != (_Base_ptr)(local_2c8 + 8)) {
      local_338._0_8_ = local_338 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Type","");
      EraseKey<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200,
                 (helper *)local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)map);
      if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_200._0_8_,
                 local_200.m_invalidKey._M_dataplus._M_p + local_200._0_8_);
      core::IO::SetEngine(io,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((pointer)local_200._0_8_ != pcVar1) {
        operator_delete((void *)local_200._0_8_);
      }
    }
    core::IO::SetParameters(io,(Params *)local_2c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2c8);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Variables","");
  anon_unknown_0::YAMLNode(&local_200,&local_140,local_208,hint,false,Sequence);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((string)local_200.m_isValid == (string)0x1) {
    if (local_200.m_pNode == (node *)0x0) {
      local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
      local_338._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_338._16_8_ = (_Base_ptr)0x0;
      aStack_320._M_allocated_capacity = 0;
      aStack_320._8_8_ = (element_type *)0x0;
LAB_0041b259:
      local_310._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if ((((((local_200.m_pNode)->m_pRef).
             super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData
           ).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_isDefined != true) goto LAB_0041b4b1;
      YAML::detail::node_data::begin
                ((node_iterator *)local_2c8,
                 ((((local_200.m_pNode)->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      if (local_200.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_338._0_8_ = CONCAT44(local_2c8._4_4_,local_2c8._0_4_);
        local_338._16_8_ = local_2c8._16_8_;
        aStack_320._M_allocated_capacity = aStack_2b0._0_8_;
        local_338._8_8_ = local_2c8._8_8_;
        aStack_320._8_8_ =
             local_200.m_pMemory.
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_0041b259;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_200.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_200.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0041b295;
        LOCK();
        (local_200.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_200.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_200.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_200.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
LAB_0041b295:
        (local_200.m_pMemory.
         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_200.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
      local_338._4_4_ = local_2c8._4_4_;
      local_338._0_4_ = local_2c8._0_4_;
      local_310._M_pi =
           local_200.m_pMemory.
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      aStack_320._8_8_ =
           local_200.m_pMemory.
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      aStack_320._M_allocated_capacity = aStack_2b0._0_8_;
      local_338._16_8_ = local_2c8._16_8_;
      local_338._8_8_ = local_2c8._8_8_;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_200.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((string)local_200.m_isValid != (string)0x1) || (local_200.m_pNode == (node *)0x0)) {
      local_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      vVar5 = NoneType;
      local_348 = (_Base_ptr)0x0;
      local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      goto LAB_0041b3a3;
    }
    YAML::detail::node_data::end
              ((node_iterator *)local_2c8,
               ((((local_200.m_pNode)->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    vVar5 = local_2c8._0_4_;
    local_360 = local_200.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_200.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._8_8_;
      local_348 = (_Base_ptr)local_2c8._16_8_;
      local_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0041b3a3;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_200.m_pMemory.
       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_200.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        iVar2 = (local_200.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count;
        goto LAB_0041b399;
      }
      LOCK();
      (local_200.m_pMemory.
       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_200.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      iVar2 = (local_200.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count + 1;
      (local_200.m_pMemory.
       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count = iVar2;
LAB_0041b399:
      (local_200.m_pMemory.
       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count = iVar2 + 1;
    }
    local_348 = (_Base_ptr)local_2c8._16_8_;
    local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._8_8_;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
LAB_0041b3a3:
    do {
      if (local_338._0_4_ == vVar5) {
        if (vVar5 == Sequence) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._8_8_ == local_358) goto LAB_0041b493;
        }
        else if ((vVar5 != Map) || ((_Base_ptr)local_338._16_8_ == local_348)) goto LAB_0041b493;
      }
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                ((value_type *)local_2c8,
                 (iterator_base<const_YAML::detail::iterator_value> *)local_338);
      IOVariableYAML((Node *)local_2c8,io,hint);
      if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
      }
      if (local_240._M_p != local_230) {
        operator_delete(local_240._M_p);
      }
      if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
      }
      if (local_280._M_p != local_270) {
        operator_delete(local_280._M_p);
      }
      if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &aStack_2b0) {
        operator_delete((void *)local_2c8._8_8_);
      }
      YAML::detail::node_iterator_base<YAML::detail::node>::operator++
                ((node_iterator_base<YAML::detail::node> *)local_338);
    } while( true );
  }
LAB_0041b4b1:
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Transports","");
  anon_unknown_0::YAMLNode((Node *)local_338,&local_160,local_208,hint,false,Sequence);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_338[0] != (string)0x1) {
LAB_0041ba0b:
    if (local_308._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._8_8_ != &aStack_320) {
      operator_delete((void *)local_338._8_8_);
    }
    if (local_200.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_200.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_200.m_invalidKey._M_dataplus._M_p != (pointer)((long)&local_200 + 0x18U)) {
      operator_delete(local_200.m_invalidKey._M_dataplus._M_p);
    }
    if (local_d0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.m_invalidKey._M_dataplus._M_p != &local_d0.m_invalidKey.field_2) {
      operator_delete(local_d0.m_invalidKey._M_dataplus._M_p);
    }
    return;
  }
  if (local_300 == (node *)0x0) {
    local_2f8.m_iterator._0_8_ = local_2f8.m_iterator._0_8_ & 0xffffffff00000000;
    local_2f8.m_iterator.m_seqIt._M_current = (node **)0x0;
    local_2f8.m_iterator.m_mapIt._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
    local_2f8.m_iterator.m_mapEnd._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
    local_2f8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
LAB_0041b5dc:
    local_2f8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0041b62c;
  }
  if (((((local_300->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_isDefined != true) goto LAB_0041ba0b;
  YAML::detail::node_data::begin
            ((node_iterator *)local_2c8,
             (((local_300->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if (local_308._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_2f8.m_iterator._0_8_ = CONCAT44(local_2c8._4_4_,local_2c8._0_4_);
    local_2f8.m_iterator.m_mapIt._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_2c8._16_8_;
    local_2f8.m_iterator.m_mapEnd._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)aStack_2b0._0_8_;
    local_2f8.m_iterator.m_seqIt._M_current = (node **)local_2c8._8_8_;
    local_2f8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_310._M_pi;
    goto LAB_0041b5dc;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0041b624;
    LOCK();
    (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
LAB_0041b624:
    (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
  }
  local_2f8.m_iterator._4_4_ = local_2c8._4_4_;
  local_2f8.m_iterator.m_type = local_2c8._0_4_;
  local_2f8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_308._M_pi;
  local_2f8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_310._M_pi;
  local_2f8.m_iterator.m_mapEnd._M_current =
       (pair<YAML::detail::node_*,_YAML::detail::node_*> *)aStack_2b0._0_8_;
  local_2f8.m_iterator.m_mapIt._M_current =
       (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_2c8._16_8_;
  local_2f8.m_iterator.m_seqIt._M_current = (node **)local_2c8._8_8_;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308._M_pi);
LAB_0041b62c:
  do {
    if ((local_338[0] == (string)0x1) && (local_300 != (node *)0x0)) {
      YAML::detail::node_data::end
                ((node_iterator *)local_2c8,
                 (((local_300->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      p_Var6 = (_Base_ptr)local_2c8._16_8_;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2c8._8_8_;
      vVar5 = local_2c8._0_4_;
      this._M_pi = local_308._M_pi;
      if (local_308._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') {
            iVar2 = (local_308._M_pi)->_M_use_count;
            goto LAB_0041b6ef;
          }
          LOCK();
          (local_308._M_pi)->_M_use_count = (local_308._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          iVar2 = (local_308._M_pi)->_M_use_count + 1;
          (local_308._M_pi)->_M_use_count = iVar2;
LAB_0041b6ef:
          (local_308._M_pi)->_M_use_count = iVar2 + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308._M_pi);
      }
    }
    else {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      p_Var6 = (_Base_ptr)0x0;
      this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      vVar5 = NoneType;
    }
    if (local_2f8.m_iterator.m_type == vVar5) {
      if (vVar5 == Map) {
        bVar7 = (_Base_ptr)local_2f8.m_iterator.m_mapIt._M_current == p_Var6;
      }
      else {
        bVar7 = true;
        if (vVar5 == Sequence) {
          bVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8.m_iterator.m_seqIt._M_current == paVar4;
        }
      }
    }
    else {
      bVar7 = false;
    }
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (bVar7) goto LAB_0041b9f9;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Type","");
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              ((value_type *)local_2c8,&local_2f8);
    std::operator+(&local_120," in transport node ",hint);
    map_00 = &local_120;
    anon_unknown_0::YAMLNode(&local_70,&local_1c0,(Node *)local_2c8,&local_120,true,Scalar);
    if (local_70.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_invalidKey._M_dataplus._M_p != &local_70.m_invalidKey.field_2) {
      operator_delete(local_70.m_invalidKey._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
    }
    if (local_240._M_p != local_230) {
      operator_delete(local_240._M_p);
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if (local_280._M_p != local_270) {
      operator_delete(local_280._M_p);
    }
    if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._8_8_ != &aStack_2b0) {
      operator_delete((void *)local_2c8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              ((value_type *)local_2c8,&local_2f8);
    anon_unknown_0::YAMLNodeMapToParams((Params *)&local_120,(Node *)local_2c8,hint);
    if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
    }
    if (local_240._M_p != local_230) {
      operator_delete(local_240._M_p);
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if (local_280._M_p != local_270) {
      operator_delete(local_280._M_p);
    }
    if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._8_8_ != &aStack_2b0) {
      operator_delete((void *)local_2c8._8_8_);
    }
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"Type","");
    EraseKey<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
               (helper *)local_180,&local_120,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)map_00);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0]);
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,CONCAT44(local_2c8._4_4_,local_2c8._0_4_),
               local_2c8._8_8_ + CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
    core::IO::AddTransport(io,&local_1a0,(Params *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) != local_2c8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_120);
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&local_2f8.m_iterator);
  } while( true );
LAB_0041b493:
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
  }
  goto LAB_0041b4b1;
LAB_0041b9f9:
  if (local_2f8.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  goto LAB_0041ba0b;
}

Assistant:

void IOYAML(core::ADIOS &adios, const YAML::Node &ioMap, core::IO &io, const std::string &hint)
{
    // Engine parameters
    const YAML::Node engineMap = YAMLNode("Engine", ioMap, hint, false, YAML::NodeType::Map);

    if (engineMap)
    {
        Params parameters = YAMLNodeMapToParams(engineMap, hint);
        auto itType = parameters.find("Type");
        if (itType != parameters.end())
        {
            const std::string type = EraseKey<std::string>("Type", parameters);
            io.SetEngine(type);
        }
        io.SetParameters(parameters);
    }

    // Variables
    const YAML::Node variablesSequence =
        YAMLNode("Variables", ioMap, hint, false, YAML::NodeType::Sequence);

    if (variablesSequence)
    {
        // loop through each variable node
        for (const YAML::Node &variableMap : variablesSequence)
        {
            IOVariableYAML(variableMap, io, hint);
        }
    }

    // Transports
    const YAML::Node transportsSequence =
        YAMLNode("Transports", ioMap, hint, false, YAML::NodeType::Sequence);

    if (transportsSequence)
    {
        // loop through each transport node
        for (auto it = transportsSequence.begin(); it != transportsSequence.end(); ++it)
        {
            YAMLNode("Type", *it, " in transport node " + hint, isMandatory,
                     YAML::NodeType::Scalar);

            Params parameters = YAMLNodeMapToParams(*it, hint);
            const std::string type = EraseKey<std::string>("Type", parameters);

            io.AddTransport(type, parameters);
        }
    }
}